

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_engine.cpp
# Opt level: O2

adios2_error adios2_engine_get_metadata(adios2_engine *engine,char **md,size_t *size)

{
  allocator local_60 [32];
  string local_40;
  
  std::__cxx11::string::string
            ((string *)&local_40,"for const adios2_engine, in call to adios2_get_metadata",local_60)
  ;
  adios2::helper::CheckForNullptr<adios2_engine>(engine,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  (**(code **)(*(long *)engine + 0x10))(engine,md,size);
  return adios2_error_none;
}

Assistant:

adios2_error adios2_engine_get_metadata(adios2_engine *engine, char **md, size_t *size)
{
    try
    {
        adios2::helper::CheckForNullptr(engine,
                                        "for const adios2_engine, in call to adios2_get_metadata");

        adios2::core::Engine *engineCpp = reinterpret_cast<adios2::core::Engine *>(engine);

        engineCpp->GetMetadata(md, size);
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_get_metadata"));
    }
}